

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_save(jit_State *J,GCtrace *T)

{
  uint uVar1;
  global_State *g;
  void *pvVar2;
  undefined4 *in_RSI;
  void *in_RDI;
  char *p;
  size_t szins;
  size_t sztr;
  
  g = (global_State *)
      ((ulong)(uint)(*(int *)((long)in_RDI + 8) - *(int *)((long)in_RDI + 0x18)) << 3);
  memcpy(in_RSI,in_RDI,0x60);
  *in_RSI = *(undefined4 *)((long)in_RDI + -0x1e8);
  *(int *)((long)in_RDI + -0x1e8) = (int)in_RSI;
  *(byte *)(in_RSI + 1) = *(byte *)((long)in_RDI + -0x1f0) & 3;
  *(undefined1 *)((long)in_RSI + 5) = 9;
  *(undefined4 **)(in_RSI + 4) = in_RSI + 0x18 + (ulong)*(uint *)((long)in_RDI + 0x18) * -2;
  pvVar2 = (void *)((long)(in_RSI + 0x18) + (long)(&g->strbloom + -1) + 0x10);
  *(void **)(in_RSI + 8) = pvVar2;
  memcpy(pvVar2,*(void **)((long)in_RDI + 0x20),(ulong)*(ushort *)((long)in_RDI + 6) * 0xc);
  pvVar2 = (void *)((ulong)*(ushort *)((long)in_RDI + 6) * 0xc + (long)pvVar2);
  *(void **)(in_RSI + 10) = pvVar2;
  memcpy(pvVar2,*(void **)((long)in_RDI + 0x28),(ulong)*(uint *)((long)in_RDI + 0x1c) << 2);
  uVar1 = *(uint *)((long)in_RDI + 0x1c);
  *(undefined2 *)((long)in_RDI + 0x50) = 0;
  *(undefined8 *)((long)in_RDI + 0x60) = 0;
  *(int *)(*(long *)((long)in_RDI + 0x170) + (ulong)*(ushort *)(in_RSI + 0x14) * 4) = (int)in_RSI;
  lj_gc_barriertrace(g,(uint32_t)((ulong)((ulong)uVar1 * 4 + (long)pvVar2) >> 0x20));
  lj_memprof_add_trace((GCtrace *)g);
  lj_sysprof_add_trace((GCtrace *)g);
  return;
}

Assistant:

static void trace_save(jit_State *J, GCtrace *T)
{
  size_t sztr = ((sizeof(GCtrace)+7)&~7);
  size_t szins = (J->cur.nins-J->cur.nk)*sizeof(IRIns);
  char *p = (char *)T + sztr;
  memcpy(T, &J->cur, sizeof(GCtrace));
  setgcrefr(T->nextgc, J2G(J)->gc.root);
  setgcrefp(J2G(J)->gc.root, T);
  newwhite(J2G(J), T);
  T->gct = ~LJ_TTRACE;
  T->ir = (IRIns *)p - J->cur.nk;  /* The IR has already been copied above. */
  p += szins;
  TRACE_APPENDVEC(snap, nsnap, SnapShot)
  TRACE_APPENDVEC(snapmap, nsnapmap, SnapEntry)
  J->cur.traceno = 0;
  J->curfinal = NULL;
  setgcrefp(J->trace[T->traceno], T);
  lj_gc_barriertrace(J2G(J), T->traceno);
  lj_gdbjit_addtrace(J, T);
#ifdef LUAJIT_USE_PERFTOOLS
  perftools_addtrace(T);
#endif

  /* Add a new trace to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_trace(T);
#endif

#if LJ_HASSYSPROF
  lj_sysprof_add_trace(T);
#endif
}